

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O2

int asio_service_test::auto_forwarding_test(bool async)

{
  RaftAsioPkg *pRVar1;
  pointer pTVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  ThreadArgs *u_args;
  ulong uVar6;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  size_t sVar8;
  long lVar9;
  int __how;
  int __how_00;
  int __how_01;
  RaftAsioPkg **entry;
  pointer ppRVar10;
  _List_node_base *p_Var11;
  int __how_02;
  value_type *__val;
  long lVar13;
  unsigned_long __val_00;
  initializer_list<RaftAsioPkg_*> __l;
  hash<std::thread::id> local_569;
  buffer_serializer bs;
  uint64_t val;
  ptr<buffer> h_result;
  raft_params param;
  mutex handlers_lock;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> pkgs;
  _Any_data local_488;
  code *local_478;
  code *pcStack_470;
  vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_> th;
  list<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
  handlers;
  vector<MsgArgs,_std::allocator<MsgArgs>_> local_430;
  _Any_data local_418;
  undefined8 local_408;
  undefined8 uStack_400;
  string s3_addr;
  string s2_addr;
  string s1_addr;
  RaftAsioPkg s1;
  RaftAsioPkg s2;
  RaftAsioPkg s3;
  raft_params *prVar12;
  
  raft_functional_common::reset_log_files();
  std::__cxx11::string::string((string *)&s1_addr,"tcp://127.0.0.1:20010",(allocator *)&s1);
  std::__cxx11::string::string((string *)&s2_addr,"tcp://127.0.0.1:20020",(allocator *)&s1);
  std::__cxx11::string::string((string *)&s3_addr,"tcp://127.0.0.1:20030",(allocator *)&s1);
  RaftAsioPkg::RaftAsioPkg(&s1,1,&s1_addr);
  RaftAsioPkg::RaftAsioPkg(&s2,2,&s2_addr);
  RaftAsioPkg::RaftAsioPkg(&s3,3,&s3_addr);
  param._8_8_ = &s2;
  __l._M_len = 3;
  __l._M_array = (iterator)&param;
  param._0_8_ = &s1;
  param._16_8_ = &s3;
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::vector
            (&pkgs,__l,(allocator_type *)&handlers_lock);
  TestSuite::_msg("launching asio-raft servers\n");
  param._0_8_ = param._0_8_ & 0xffffffffffffff00;
  param.heart_beat_interval_ = 0;
  param.rpc_failure_backoff_ = 0;
  param.log_sync_batch_size_ = 0;
  param.log_sync_stop_gap_ = 0;
  param.snapshot_distance_ = 0;
  param.snapshot_block_size_ = 0;
  param.enable_randomized_snapshot_creation_ = false;
  param._33_3_ = 0;
  param.max_append_size_ = 0;
  param.reserved_log_items_._0_2_ = 1;
  iVar4 = launch_servers(&pkgs,false,false,true,(init_options *)&param);
  std::_Function_base::~_Function_base((_Function_base *)&param.heart_beat_interval_);
  if (iVar4 != 0) {
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar5 = std::operator<<(poVar5,"        time: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,(string *)&param);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"      thread: ");
    poVar5 = std::operator<<(poVar5,"\x1b[33m");
    lVar9 = *(long *)poVar5;
    lVar13 = *(long *)(lVar9 + -0x18);
    *(uint *)(poVar5 + lVar13 + 0x18) = *(uint *)(poVar5 + lVar13 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x10) = 4;
    poVar5 = std::operator<<(poVar5,0x30);
    handlers_lock.super___mutex_base._M_mutex.__align = pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs,(id *)&handlers_lock);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          in: ");
    poVar5 = std::operator<<(poVar5,"\x1b[36m");
    poVar5 = std::operator<<(poVar5,"auto_forwarding_test");
    poVar5 = std::operator<<(poVar5,"()\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          at: ");
    poVar5 = std::operator<<(poVar5,"\x1b[32m");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar5 = std::operator<<(poVar5,"\x1b[0m:");
    poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x588);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34mlaunch_servers(pkgs, false)\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
    poVar5 = std::operator<<(poVar5,"0");
    poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
    iVar4 = -1;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,-1);
    std::operator<<(poVar5,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)&param);
    TestSuite::failHandler();
    goto LAB_0019afa8;
  }
  TestSuite::_msg("organizing raft group\n");
  iVar4 = make_group(&pkgs);
  if (iVar4 != 0) {
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar5 = std::operator<<(poVar5,"        time: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,(string *)&param);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"      thread: ");
    poVar5 = std::operator<<(poVar5,"\x1b[33m");
    lVar9 = *(long *)poVar5;
    lVar13 = *(long *)(lVar9 + -0x18);
    *(uint *)(poVar5 + lVar13 + 0x18) = *(uint *)(poVar5 + lVar13 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x10) = 4;
    poVar5 = std::operator<<(poVar5,0x30);
    handlers_lock.super___mutex_base._M_mutex.__align = pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&bs,(id *)&handlers_lock);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          in: ");
    poVar5 = std::operator<<(poVar5,"\x1b[36m");
    poVar5 = std::operator<<(poVar5,"auto_forwarding_test");
    poVar5 = std::operator<<(poVar5,"()\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          at: ");
    poVar5 = std::operator<<(poVar5,"\x1b[32m");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar5 = std::operator<<(poVar5,"\x1b[0m:");
    poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x58b);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34mmake_group(pkgs)\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
    poVar5 = std::operator<<(poVar5,"0");
    poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
    iVar4 = -1;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,-1);
    std::operator<<(poVar5,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)&param);
    TestSuite::failHandler();
    goto LAB_0019afa8;
  }
  for (ppRVar10 = pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      ppRVar10 !=
      pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppRVar10 = ppRVar10 + 1) {
    pRVar1 = *ppRVar10;
    nuraft::raft_server::get_current_params
              (&param,(pRVar1->raftServer).
                      super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    param.auto_forwarding_ = true;
    param.auto_forwarding_max_connections_ = 2;
    if (async) {
      param.return_method_ = async_handler;
    }
    nuraft::raft_server::update_params
              ((pRVar1->raftServer).
               super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&param);
  }
  handlers_lock.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  handlers_lock.super___mutex_base._M_mutex._16_8_ = 0;
  handlers_lock.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  handlers_lock.super___mutex_base._M_mutex.__align = 0;
  handlers_lock.super___mutex_base._M_mutex._8_8_ = 0;
  handlers.
  super__List_base<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&handlers;
  handlers.
  super__List_base<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
  ._M_impl._M_node._M_size = 0;
  handlers.
  super__List_base<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       handlers.
       super__List_base<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>::vector
            (&th,0x14,(allocator_type *)&param);
  u_args = (ThreadArgs *)operator_new(0xa0);
  local_430.super__Vector_base<MsgArgs,_std::allocator<MsgArgs>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(u_args + 0xa0);
  *(undefined8 *)u_args = 0;
  for (lVar9 = 8; lVar9 != 0xa0; lVar9 = lVar9 + 8) {
    *(undefined8 *)(u_args + lVar9) = 0;
  }
  lVar9 = 0;
  local_430.super__Vector_base<MsgArgs,_std::allocator<MsgArgs>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)u_args;
  local_430.super__Vector_base<MsgArgs,_std::allocator<MsgArgs>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_430.super__Vector_base<MsgArgs,_std::allocator<MsgArgs>_>._M_impl.
       super__Vector_impl_data._M_finish;
  for (lVar13 = 0;
      pTVar2 = th.
               super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
               ._M_impl.super__Vector_impl_data._M_start, lVar13 != 0x14; lVar13 = lVar13 + 1) {
    *(long *)u_args = lVar13;
    local_488._M_unused._M_object = (void *)0x0;
    local_488._8_8_ = 0;
    local_478 = (code *)0x0;
    pcStack_470 = (code *)0x0;
    local_488._M_unused._M_object = operator_new(0x18);
    *(RaftAsioPkg **)local_488._M_unused._0_8_ = &s2;
    *(mutex **)((long)local_488._M_unused._0_8_ + 8) = &handlers_lock;
    *(list<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
      **)((long)local_488._M_unused._0_8_ + 0x10) = &handlers;
    pcStack_470 = std::
                  _Function_handler<int_(TestSuite::ThreadArgs_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx:1440:21)>
                  ::_M_invoke;
    local_478 = std::
                _Function_handler<int_(TestSuite::ThreadArgs_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx:1440:21)>
                ::_M_manager;
    local_418._M_unused._M_object = (void *)0x0;
    local_418._8_8_ = 0;
    local_408 = 0;
    uStack_400 = 0;
    TestSuite::ThreadHolder::spawn
              ((ThreadHolder *)((long)&pTVar2->tid + lVar9),u_args,(ThreadFunc *)&local_488,
               (ThreadExitHandler *)&local_418);
    std::_Function_base::~_Function_base((_Function_base *)&local_418);
    std::_Function_base::~_Function_base((_Function_base *)&local_488);
    lVar9 = lVar9 + 0x58;
    u_args = u_args + 8;
  }
  std::__cxx11::string::string((string *)&param,"replication",(allocator *)&bs);
  TestSuite::sleep_sec(1,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  lVar9 = 0;
  do {
    if (lVar9 + 0x58 == 0x738) {
      __val_00 = 0;
      goto LAB_0019a446;
    }
    TestSuite::ThreadHolder::join
              ((ThreadHolder *)
               ((long)&(th.
                        super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                        ._M_impl.super__Vector_impl_data._M_start)->tid + lVar9),false);
    iVar4 = *(int *)((long)&((th.
                              super__Vector_base<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
                              ._M_impl.super__Vector_impl_data._M_start)->args).rc + lVar9);
    lVar9 = lVar9 + 0x58;
  } while (iVar4 == 0);
  poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar5 = std::operator<<(poVar5,"        time: ");
  poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
  TestSuite::getTimeString_abi_cxx11_();
  poVar5 = std::operator<<(poVar5,(string *)&param);
  poVar5 = std::operator<<(poVar5,"\x1b[0m");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"      thread: ");
  poVar5 = std::operator<<(poVar5,"\x1b[33m");
  lVar9 = *(long *)poVar5;
  lVar13 = *(long *)(lVar9 + -0x18);
  *(uint *)(poVar5 + lVar13 + 0x18) = *(uint *)(poVar5 + lVar13 + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x10) = 4;
  poVar5 = std::operator<<(poVar5,0x30);
  bs._0_8_ = pthread_self();
  std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&h_result,(id *)&bs);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar5 = std::operator<<(poVar5,"\x1b[0m");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"          in: ");
  poVar5 = std::operator<<(poVar5,"\x1b[36m");
  poVar5 = std::operator<<(poVar5,"auto_forwarding_test");
  poVar5 = std::operator<<(poVar5,"()\x1b[0m");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"          at: ");
  poVar5 = std::operator<<(poVar5,"\x1b[32m");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                          );
  poVar5 = std::operator<<(poVar5,"\x1b[0m:");
  poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5b7);
  poVar5 = std::operator<<(poVar5,"\x1b[0m");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34mth[ii].getResult()\x1b[0m\n");
  poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
  poVar5 = std::operator<<(poVar5,"0");
  poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
  poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
  std::operator<<(poVar5,"\x1b[0m\n");
  std::__cxx11::string::~string((string *)&param);
  TestSuite::failHandler();
LAB_0019af7e:
  iVar4 = -1;
  goto LAB_0019af81;
LAB_0019a446:
  if (__val_00 == 0x14) goto LAB_0019a49a;
  std::__cxx11::to_string((string *)&bs,__val_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&param,"test",
                 (string *)&bs);
  std::__cxx11::string::~string((string *)&bs);
  uVar6 = raft_functional_common::TestSm::isCommitted
                    ((TestSm *)
                     s1.sm.super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,(string *)&param);
  if ((int)uVar6 < 1) {
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar5 = std::operator<<(poVar5,"        time: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,(string *)&bs);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"      thread: ");
    poVar5 = std::operator<<(poVar5,"\x1b[33m");
    lVar9 = *(long *)poVar5;
    lVar13 = *(long *)(lVar9 + -0x18);
    *(uint *)(poVar5 + lVar13 + 0x18) = *(uint *)(poVar5 + lVar13 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x10) = 4;
    poVar5 = std::operator<<(poVar5,0x30);
    h_result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&val,(id *)&h_result);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          in: ");
    poVar5 = std::operator<<(poVar5,"\x1b[36m");
    poVar5 = std::operator<<(poVar5,"auto_forwarding_test");
    poVar5 = std::operator<<(poVar5,"()\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          at: ");
    poVar5 = std::operator<<(poVar5,"\x1b[32m");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar5 = std::operator<<(poVar5,"\x1b[0m:");
    poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5bd);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"    expected: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;34ms1.getTestSm()->isCommitted(test_msg) > 0\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"    value of ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;32ms1.getTestSm()->isCommitted(test_msg)\x1b[0m: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;31m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar6);
    poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"    value of ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;32m0\x1b[0m: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;31m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
    std::operator<<(poVar5,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)&bs);
    TestSuite::failHandler();
    std::__cxx11::string::~string((string *)&param);
    goto LAB_0019af7e;
  }
  std::__cxx11::string::~string((string *)&param);
  __val_00 = __val_00 + 1;
  goto LAB_0019a446;
LAB_0019a49a:
  param._8_8_ = param._8_8_ & 0xffffffff00000000;
  param.log_sync_batch_size_ = 0;
  param.log_sync_stop_gap_ = 0;
  param.reserved_log_items_ = 0;
  param.client_req_timeout_ = 0;
  param._24_8_ = &param.heart_beat_interval_;
  param._32_8_ = &param.heart_beat_interval_;
  std::mutex::lock(&handlers_lock);
  p_Var11 = (_List_node_base *)&handlers;
  while (p_Var11 = (((_List_base<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
                      *)&p_Var11->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var11 != (_List_node_base *)&handlers) {
    p_Var7 = &nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
              ::get((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *
                    )p_Var11[1]._M_next)->
              super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&h_result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,p_Var7);
    if (h_result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar5 = std::operator<<(poVar5,"        time: ");
      poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,(string *)&bs);
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"      thread: ");
      poVar5 = std::operator<<(poVar5,"\x1b[33m");
      lVar9 = *(long *)poVar5;
      lVar13 = *(long *)(lVar9 + -0x18);
      *(uint *)(poVar5 + lVar13 + 0x18) = *(uint *)(poVar5 + lVar13 + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x10) = 4;
      poVar5 = std::operator<<(poVar5,0x30);
      val = pthread_self();
      std::hash<std::thread::id>::operator()(&local_569,(id *)&val);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"          in: ");
      poVar5 = std::operator<<(poVar5,"\x1b[36m");
      poVar5 = std::operator<<(poVar5,"auto_forwarding_test");
      poVar5 = std::operator<<(poVar5,"()\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"          at: ");
      poVar5 = std::operator<<(poVar5,"\x1b[32m");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                              );
      poVar5 = std::operator<<(poVar5,"\x1b[0m:");
      poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5c6);
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34mh_result\x1b[0m\n");
      poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
      poVar5 = std::operator<<(poVar5,"non-NULL");
      poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
      poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
      poVar5 = std::operator<<(poVar5,"NULL");
      std::operator<<(poVar5,"\x1b[0m\n");
      std::__cxx11::string::~string((string *)&bs);
      TestSuite::failHandler();
LAB_0019ad22:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&h_result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      goto LAB_0019af67;
    }
    sVar8 = nuraft::buffer::size
                      (h_result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if ((int)sVar8 != 8) {
      poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar5 = std::operator<<(poVar5,"        time: ");
      poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar5 = std::operator<<(poVar5,(string *)&bs);
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"      thread: ");
      poVar5 = std::operator<<(poVar5,"\x1b[33m");
      lVar9 = *(long *)poVar5;
      lVar13 = *(long *)(lVar9 + -0x18);
      *(uint *)(poVar5 + lVar13 + 0x18) = *(uint *)(poVar5 + lVar13 + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x10) = 4;
      poVar5 = std::operator<<(poVar5,0x30);
      val = pthread_self();
      std::hash<std::thread::id>::operator()(&local_569,(id *)&val);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"          in: ");
      poVar5 = std::operator<<(poVar5,"\x1b[36m");
      poVar5 = std::operator<<(poVar5,"auto_forwarding_test");
      poVar5 = std::operator<<(poVar5,"()\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"          at: ");
      poVar5 = std::operator<<(poVar5,"\x1b[32m");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                              );
      poVar5 = std::operator<<(poVar5,"\x1b[0m:");
      poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5c7);
      poVar5 = std::operator<<(poVar5,"\x1b[0m");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34mh_result->size()\x1b[0m\n");
      poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,8);
      poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
      poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)sVar8);
      std::operator<<(poVar5,"\x1b[0m\n");
      std::__cxx11::string::~string((string *)&bs);
      TestSuite::failHandler();
      goto LAB_0019ad22;
    }
    nuraft::buffer_serializer::buffer_serializer
              (&bs,(ptr<buffer> *)
                   &h_result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,LITTLE);
    val = nuraft::buffer_serializer::get_u64(&bs);
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)&param,&val);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&h_result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  if (param._40_8_ != 0x14) {
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar5 = std::operator<<(poVar5,"        time: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,(string *)&bs);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"      thread: ");
    poVar5 = std::operator<<(poVar5,"\x1b[33m");
    lVar9 = *(long *)poVar5;
    lVar13 = *(long *)(lVar9 + -0x18);
    *(uint *)(poVar5 + lVar13 + 0x18) = *(uint *)(poVar5 + lVar13 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x10) = 4;
    poVar5 = std::operator<<(poVar5,0x30);
    h_result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&val,(id *)&h_result);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          in: ");
    poVar5 = std::operator<<(poVar5,"\x1b[36m");
    poVar5 = std::operator<<(poVar5,"auto_forwarding_test");
    poVar5 = std::operator<<(poVar5,"()\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          at: ");
    poVar5 = std::operator<<(poVar5,"\x1b[32m");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar5 = std::operator<<(poVar5,"\x1b[0m:");
    poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5cd);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"    value of: \x1b[1;34mcommit_results.size()\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)&bs);
    TestSuite::failHandler();
LAB_0019af67:
    pthread_mutex_unlock((pthread_mutex_t *)&handlers_lock);
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)&param);
    goto LAB_0019af7e;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&handlers_lock);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)&param);
  bVar3 = raft_functional_common::TestSm::isSame
                    ((TestSm *)
                     s2.sm.super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,(TestSm *)
                            s1.sm.
                            super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,false);
  if (!bVar3) {
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar5 = std::operator<<(poVar5,"        time: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,(string *)&param);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"      thread: ");
    poVar5 = std::operator<<(poVar5,"\x1b[33m");
    lVar9 = *(long *)poVar5;
    lVar13 = *(long *)(lVar9 + -0x18);
    *(uint *)(poVar5 + lVar13 + 0x18) = *(uint *)(poVar5 + lVar13 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x10) = 4;
    poVar5 = std::operator<<(poVar5,0x30);
    bs._0_8_ = pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&h_result,(id *)&bs);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          in: ");
    poVar5 = std::operator<<(poVar5,"\x1b[36m");
    poVar5 = std::operator<<(poVar5,"auto_forwarding_test");
    poVar5 = std::operator<<(poVar5,"()\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          at: ");
    poVar5 = std::operator<<(poVar5,"\x1b[32m");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar5 = std::operator<<(poVar5,"\x1b[0m:");
    poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5d1);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,
                             "    value of: \x1b[1;34ms2.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                            );
    poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
    poVar5 = std::operator<<(poVar5,"true");
    poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
    poVar5 = std::operator<<(poVar5,"false");
    std::operator<<(poVar5,"\x1b[0m\n");
LAB_0019b47a:
    std::__cxx11::string::~string((string *)&param);
    TestSuite::failHandler();
    goto LAB_0019af7e;
  }
  bVar3 = raft_functional_common::TestSm::isSame
                    ((TestSm *)
                     s3.sm.super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,(TestSm *)
                            s1.sm.
                            super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,false);
  iVar4 = (int)s1.sm.super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (!bVar3) {
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar5 = std::operator<<(poVar5,"        time: ");
    poVar5 = std::operator<<(poVar5,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,(string *)&param);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"      thread: ");
    poVar5 = std::operator<<(poVar5,"\x1b[33m");
    lVar9 = *(long *)poVar5;
    lVar13 = *(long *)(lVar9 + -0x18);
    *(uint *)(poVar5 + lVar13 + 0x18) = *(uint *)(poVar5 + lVar13 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar5 + *(long *)(lVar9 + -0x18) + 0x10) = 4;
    poVar5 = std::operator<<(poVar5,0x30);
    bs._0_8_ = pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&h_result,(id *)&bs);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          in: ");
    poVar5 = std::operator<<(poVar5,"\x1b[36m");
    poVar5 = std::operator<<(poVar5,"auto_forwarding_test");
    poVar5 = std::operator<<(poVar5,"()\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"          at: ");
    poVar5 = std::operator<<(poVar5,"\x1b[32m");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar5 = std::operator<<(poVar5,"\x1b[0m:");
    poVar5 = std::operator<<(poVar5,"\x1b[1;35m");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5d2);
    poVar5 = std::operator<<(poVar5,"\x1b[0m");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,
                             "    value of: \x1b[1;34ms3.getTestSm()->isSame( *s1.getTestSm() )\x1b[0m\n"
                            );
    poVar5 = std::operator<<(poVar5,"    expected: \x1b[1;32m");
    poVar5 = std::operator<<(poVar5,"true");
    poVar5 = std::operator<<(poVar5,"\x1b[0m\n");
    poVar5 = std::operator<<(poVar5,"      actual: \x1b[1;31m");
    poVar5 = std::operator<<(poVar5,"false");
    std::operator<<(poVar5,"\x1b[0m\n");
    goto LAB_0019b47a;
  }
  nuraft::raft_server::shutdown
            (s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,iVar4,__how);
  nuraft::raft_server::shutdown
            (s2.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,iVar4,__how_00);
  nuraft::raft_server::shutdown
            (s3.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,iVar4,__how_01);
  std::__cxx11::string::string((string *)&param,"shutting down",(allocator *)&bs);
  prVar12 = &param;
  TestSuite::sleep_sec(1,(string *)prVar12);
  __how_02 = (int)prVar12;
  prVar12 = &param;
  std::__cxx11::string::~string((string *)prVar12);
  iVar4 = 0;
  SimpleLogger::shutdown((int)prVar12,__how_02);
LAB_0019af81:
  std::vector<MsgArgs,_std::allocator<MsgArgs>_>::~vector(&local_430);
  std::vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>::~vector(&th);
  std::__cxx11::
  _List_base<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
  ::_M_clear(&handlers.
              super__List_base<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::allocator<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_>_>
            );
LAB_0019afa8:
  std::_Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::~_Vector_base
            (&pkgs.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>);
  RaftAsioPkg::~RaftAsioPkg(&s3);
  RaftAsioPkg::~RaftAsioPkg(&s2);
  RaftAsioPkg::~RaftAsioPkg(&s1);
  std::__cxx11::string::~string((string *)&s3_addr);
  std::__cxx11::string::~string((string *)&s2_addr);
  std::__cxx11::string::~string((string *)&s1_addr);
  return iVar4;
}

Assistant:

int auto_forwarding_test(bool async) {
    reset_log_files();

    std::string s1_addr = "tcp://127.0.0.1:20010";
    std::string s2_addr = "tcp://127.0.0.1:20020";
    std::string s3_addr = "tcp://127.0.0.1:20030";

    RaftAsioPkg s1(1, s1_addr);
    RaftAsioPkg s2(2, s2_addr);
    RaftAsioPkg s3(3, s3_addr);
    std::vector<RaftAsioPkg*> pkgs = {&s1, &s2, &s3};

    _msg("launching asio-raft servers\n");
    CHK_Z( launch_servers(pkgs, false) );

    _msg("organizing raft group\n");
    CHK_Z( make_group(pkgs) );

    // Set async.
    for (auto& entry: pkgs) {
        RaftAsioPkg* pp = entry;
        raft_params param = pp->raftServer->get_current_params();
        param.auto_forwarding_ = true;
        param.auto_forwarding_max_connections_ = 2;
        if (async) {
            param.return_method_ = raft_params::async_handler;
        }
        pp->raftServer->update_params(param);
    }

    // Append messages in parallel into S2 (follower).
    struct MsgArgs : TestSuite::ThreadArgs {
        size_t ii;
    };

    std::mutex handlers_lock;
    std::list< ptr< cmd_result< ptr<buffer> > > > handlers;
    auto send_msg = [&](TestSuite::ThreadArgs* t_args) -> int {
        MsgArgs* args = (MsgArgs*)t_args;
        std::string test_msg = "test" + std::to_string(args->ii);
        ptr<buffer> msg = buffer::alloc(test_msg.size() + 1);
        msg->put(test_msg);
        ptr< cmd_result< ptr<buffer> > > ret =
            s2.raftServer->append_entries( {msg} );

        std::lock_guard<std::mutex> l(handlers_lock);
        handlers.push_back(ret);
        return 0;
    };

    const size_t NUM_PARALLEL_MSGS = 20;
    std::vector<TestSuite::ThreadHolder> th(NUM_PARALLEL_MSGS);
    std::vector<MsgArgs> m_args(NUM_PARALLEL_MSGS);
    for (size_t ii = 0; ii < NUM_PARALLEL_MSGS; ++ii) {
        m_args[ii].ii = ii;
        th[ii].spawn(&m_args[ii], send_msg, nullptr);
    }
    TestSuite::sleep_sec(1, "replication");
    for (size_t ii = 0; ii < NUM_PARALLEL_MSGS; ++ii) {
        th[ii].join();
        CHK_Z(th[ii].getResult());
    }

    // All messages should have been committed in the state machine.
    for (size_t ii = 0; ii < NUM_PARALLEL_MSGS; ++ii) {
        std::string test_msg = "test" + std::to_string(ii);
        CHK_GT(s1.getTestSm()->isCommitted(test_msg), 0);
    }

    // All handlers should have the result.
    {
        std::set<uint64_t> commit_results;
        std::lock_guard<std::mutex> l(handlers_lock);
        for (auto& handler: handlers) {
            ptr<buffer> h_result = handler->get();
            CHK_NONNULL(h_result);
            CHK_EQ(8, h_result->size());
            buffer_serializer bs(h_result);
            uint64_t val = bs.get_u64();
            commit_results.insert(val);
        }
        // All messages should have delivered their results.
        CHK_EQ(NUM_PARALLEL_MSGS, commit_results.size());
    }

    // State machine should be identical.
    CHK_OK( s2.getTestSm()->isSame( *s1.getTestSm() ) );
    CHK_OK( s3.getTestSm()->isSame( *s1.getTestSm() ) );

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();
    TestSuite::sleep_sec(1, "shutting down");

    SimpleLogger::shutdown();
    return 0;
}